

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall
tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  int lineNum;
  XMLDocument *this_00;
  XMLNode *node_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  undefined4 extraout_var_04;
  char *pcVar5;
  char *__s2;
  XMLDocument *pXVar6;
  bool bVar7;
  StrPair endTag;
  XMLNode *node;
  StrPair local_70;
  XMLDocument *local_58;
  XMLNode *local_50;
  char *local_48;
  StrPair *local_40;
  int *local_38;
  undefined4 extraout_var_00;
  
  pXVar6 = this->_document;
  iVar1 = pXVar6->_parsingDepth + 1;
  pXVar6->_parsingDepth = iVar1;
  local_38 = curLineNumPtr;
  if (iVar1 == 100) {
    XMLDocument::SetError
              (pXVar6,XML_ELEMENT_DEPTH_EXCEEDED,pXVar6->_parseCurLineNum,
               "Element nesting is too deep.");
  }
  local_58 = pXVar6;
  local_40 = parentEndTag;
  if (this->_document->_errorID == XML_SUCCESS) {
    do {
      if ((p == (char *)0x0) || (*p == '\0')) goto LAB_0021f7f7;
      local_50 = (XMLNode *)0x0;
      p = XMLDocument::Identify(this->_document,p,&local_50);
      node_00 = local_50;
      if (local_50 == (XMLNode *)0x0) {
        iVar1 = 3;
      }
      else {
        lineNum = local_50->_parseLineNum;
        local_70._flags = 0;
        local_70._start = (char *)0x0;
        local_70._end = (char *)0x0;
        iVar1 = (*local_50->_vptr_XMLNode[0x11])(local_50,p,&local_70);
        p = (char *)CONCAT44(extraout_var,iVar1);
        if (p == (char *)0x0) {
          DeleteNode(node_00);
          iVar1 = 3;
          if (this->_document->_errorID == XML_SUCCESS) {
            XMLDocument::SetError(this->_document,XML_ERROR_PARSING,lineNum,(char *)0x0);
          }
        }
        else {
          iVar1 = (*node_00->_vptr_XMLNode[4])(node_00);
          plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
          if (plVar3 != (long *)0x0) {
            iVar2 = (*this->_vptr_XMLNode[3])(this);
            iVar1 = 0;
            if (CONCAT44(extraout_var_01,iVar2) == 0) {
LAB_0021f91c:
              bVar7 = false;
            }
            else if (this->_firstChild == (XMLNode *)0x0) {
              bVar7 = true;
            }
            else {
              iVar2 = (*this->_firstChild->_vptr_XMLNode[4])();
              if ((CONCAT44(extraout_var_02,iVar2) == 0) || (this->_lastChild == (XMLNode *)0x0))
              goto LAB_0021f91c;
              iVar2 = (*this->_lastChild->_vptr_XMLNode[4])();
              bVar7 = CONCAT44(extraout_var_03,iVar2) != 0;
            }
            if (!bVar7) {
              pXVar6 = this->_document;
              lVar4 = (**(code **)(*plVar3 + 0x48))(plVar3);
              if (lVar4 == 0) {
                pcVar5 = StrPair::GetStr((StrPair *)(plVar3 + 3));
              }
              else {
                pcVar5 = (char *)0x0;
              }
              XMLDocument::SetError
                        (pXVar6,XML_ERROR_PARSING_DECLARATION,lineNum,"XMLDeclaration value=%s",
                         pcVar5);
              iVar1 = 3;
              DeleteNode(node_00);
            }
            pXVar6 = local_58;
            if (!bVar7) goto LAB_0021fab5;
          }
          iVar1 = (**node_00->_vptr_XMLNode)(node_00);
          plVar3 = (long *)CONCAT44(extraout_var_04,iVar1);
          if (plVar3 == (long *)0x0) {
LAB_0021faa8:
            iVar1 = 0;
            InsertEndChild(this,node_00);
          }
          else {
            iVar1 = (int)plVar3[0xd];
            if (iVar1 == 2) {
              if (local_40 != (StrPair *)0x0) {
                StrPair::TransferTo((StrPair *)(plVar3 + 3),local_40);
              }
              (*node_00->_memPool->_vptr_MemPool[5])();
              iVar1 = 1;
              DeleteNode(node_00);
              local_48 = p;
            }
            else {
              bVar7 = iVar1 == 0 || local_70._start != local_70._end;
              if ((local_70._start != local_70._end) && (iVar1 == 0)) {
                pcVar5 = StrPair::GetStr(&local_70);
                lVar4 = (**(code **)(*plVar3 + 0x48))(plVar3);
                if (lVar4 == 0) {
                  __s2 = StrPair::GetStr((StrPair *)(plVar3 + 3));
                }
                else {
                  __s2 = (char *)0x0;
                }
                if (pcVar5 == __s2) {
                  bVar7 = false;
                }
                else {
                  iVar1 = strncmp(pcVar5,__s2,0x7fffffff);
                  bVar7 = iVar1 != 0;
                }
              }
              iVar1 = 0;
              if (bVar7) {
                this_00 = this->_document;
                lVar4 = (**(code **)(*plVar3 + 0x48))(plVar3);
                if (lVar4 == 0) {
                  pcVar5 = StrPair::GetStr((StrPair *)(plVar3 + 3));
                }
                else {
                  pcVar5 = (char *)0x0;
                }
                XMLDocument::SetError
                          (this_00,XML_ERROR_MISMATCHED_ELEMENT,lineNum,"XMLElement name=%s",pcVar5)
                ;
                iVar1 = 3;
                DeleteNode(node_00);
              }
              if (!bVar7) goto LAB_0021faa8;
            }
          }
        }
LAB_0021fab5:
        if (((local_70._flags & 0x200U) != 0) && (local_70._start != (char *)0x0)) {
          operator_delete__(local_70._start);
        }
        local_70._flags = 0;
        local_70._start = (char *)0x0;
        local_70._end = (char *)0x0;
      }
    } while (iVar1 == 0);
    if (iVar1 != 3) goto LAB_0021f7f9;
  }
LAB_0021f7f7:
  local_48 = (char *)0x0;
LAB_0021f7f9:
  pXVar6->_parsingDepth = pXVar6->_parsingDepth + -1;
  return local_48;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEndTag, int* curLineNumPtr )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

	XMLDocument::DepthTracker tracker(_document);
	if (_document->Error())
		return 0;

	while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        TIXMLASSERT( p );
        if ( node == 0 ) {
            break;
        }

       const int initialLineNum = node->_parseLineNum;

        StrPair endTag;
        p = node->ParseDeep( p, &endTag, curLineNumPtr );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, initialLineNum, 0);
            }
            break;
        }

        const XMLDeclaration* const decl = node->ToDeclaration();
        if ( decl ) {
            // Declarations are only allowed at document level
            //
            // Multiple declarations are allowed but all declarations
            // must occur before anything else. 
            //
            // Optimized due to a security test case. If the first node is 
            // a declaration, and the last node is a declaration, then only 
            // declarations have so far been added.
            bool wellLocated = false;

            if (ToDocument()) {
                if (FirstChild()) {
                    wellLocated =
                        FirstChild() &&
                        FirstChild()->ToDeclaration() &&
                        LastChild() &&
                        LastChild()->ToDeclaration();
                }
                else {
                    wellLocated = true;
                }
            }
            if ( !wellLocated ) {
                _document->SetError( XML_ERROR_PARSING_DECLARATION, initialLineNum, "XMLDeclaration value=%s", decl->Value());
                DeleteNode( node );
                break;
            }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEndTag ) {
                    ele->_value.TransferTo( parentEndTag );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, initialLineNum, "XMLElement name=%s", ele->Name());
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}